

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[18],kj::StringPtr&,kj::String&,char_const(&)[17]>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],StringPtr *params_1,
          String *params_2,char (*params_3) [17])

{
  char (*value) [18];
  StringPtr *value_00;
  String *value_01;
  char (*value_02) [17];
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  char (*params_local_3) [17];
  String *params_local_2;
  StringPtr *params_local_1;
  char (*params_local) [18];
  
  local_30 = params_2;
  params_local_3 = (char (*) [17])params_1;
  params_local_2 = (String *)params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [18])__return_storage_ptr__;
  value = ::const((char (*) [18])this);
  local_40 = toCharSequence<char_const(&)[18]>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_50 = toCharSequence<kj::StringPtr&>(value_00);
  value_01 = fwd<kj::String&>((String *)params_local_3);
  local_60 = toCharSequence<kj::String&>(value_01);
  value_02 = ::const((char (*) [17])local_30);
  local_70 = toCharSequence<char_const(&)[17]>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}